

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_matrix_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          bool need_transpose)

{
  uint uVar1;
  string local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  uint32_t *local_198;
  SPIRType tmp_type;
  
  local_198 = indices;
  if (matrix_stride != 0) {
    SPIRType::SPIRType(&tmp_type,target_type);
    if (need_transpose) {
      tmp_type._24_8_ = tmp_type._24_8_ << 0x20 | (ulong)tmp_type._24_8_ >> 0x20;
    }
    local_1a0 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1a0;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    type_to_glsl_constructor_abi_cxx11_(&local_1c0,this,&tmp_type);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (tmp_type.columns != 0) {
      uVar1 = 0;
      do {
        if (uVar1 != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        flattened_access_chain_vector_abi_cxx11_
                  (&local_1c0,this,base,local_198,count,&tmp_type,offset,matrix_stride,false);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        uVar1 = uVar1 + 1;
        offset = offset + matrix_stride;
      } while (uVar1 < tmp_type.columns);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    tmp_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00360128;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&tmp_type.member_name_cache._M_h);
    tmp_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)
        tmp_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
        &tmp_type.member_type_index_redirection.stack_storage) {
      free(tmp_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
    }
    tmp_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
         = 0;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
        tmp_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
        &tmp_type.member_types.stack_storage) {
      free(tmp_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr)
      ;
    }
    tmp_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
    if ((AlignedBuffer<bool,_8UL> *)tmp_type.array_size_literal.super_VectorView<bool>.ptr !=
        &tmp_type.array_size_literal.stack_storage) {
      free(tmp_type.array_size_literal.super_VectorView<bool>.ptr);
    }
    tmp_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)tmp_type.array.super_VectorView<unsigned_int>.ptr !=
        &tmp_type.array.stack_storage) {
      free(tmp_type.array.super_VectorView<unsigned_int>.ptr);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("matrix_stride",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0x2b14,
                "std::string spirv_cross::CompilerGLSL::flattened_access_chain_matrix(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
               );
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_matrix(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset,
                                                        uint32_t matrix_stride, bool need_transpose)
{
	assert(matrix_stride);
	SPIRType tmp_type = target_type;
	if (need_transpose)
		swap(tmp_type.vecsize, tmp_type.columns);

	std::string expr;

	expr += type_to_glsl_constructor(tmp_type);
	expr += "(";

	for (uint32_t i = 0; i < tmp_type.columns; i++)
	{
		if (i != 0)
			expr += ", ";

		expr += flattened_access_chain_vector(base, indices, count, tmp_type, offset + i * matrix_stride, matrix_stride,
		                                      /* need_transpose= */ false);
	}

	expr += ")";

	return expr;
}